

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_parse_elements(mpack_tree_parser_t *parser)

{
  mpack_node_data_t *node_00;
  mpack_error_t mVar1;
  mpack_node_data_t *node;
  mpack_tree_parser_t *parser_local;
  
  do {
    node_00 = parser->stack[parser->level].child;
    parser->stack[parser->level].left = parser->stack[parser->level].left - 1;
    parser->stack[parser->level].child = parser->stack[parser->level].child + 1;
    mpack_tree_parse_node(parser,node_00);
    mVar1 = mpack_tree_error(parser->tree);
    if (mVar1 != mpack_ok) {
      return;
    }
    while (parser->stack[parser->level].left == 0) {
      if (parser->level == 0) {
        return;
      }
      parser->level = parser->level - 1;
    }
  } while( true );
}

Assistant:

static void mpack_tree_parse_elements(mpack_tree_parser_t* parser) {
    mpack_log("parsing tree elements\n");

    // we loop parsing nodes until the parse stack is empty. we break
    // by returning out of the function.
    while (true) {
        mpack_node_data_t* node = parser->stack[parser->level].child;
        --parser->stack[parser->level].left;
        ++parser->stack[parser->level].child;

        mpack_tree_parse_node(parser, node);

        if (mpack_tree_error(parser->tree) != mpack_ok)
            break;

        // pop empty stack levels, exiting the outer loop when the stack is empty.
        // (we could tail-optimize containers by pre-emptively popping empty
        // stack levels before reading the new element, this way we wouldn't
        // have to loop. but we eventually want to use the parse stack to give
        // better error messages that contain the location of the error, so
        // it needs to be complete.)
        while (parser->stack[parser->level].left == 0) {
            if (parser->level == 0)
                return;
            --parser->level;
        }
    }
}